

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.c
# Opt level: O0

int isearch(int dir)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ushort **ppuVar6;
  undefined1 local_88 [4];
  int cdotline;
  char opat [80];
  int i;
  int xcase;
  int firstc;
  int pptr;
  int success;
  int cbo;
  int c;
  line *clp;
  int dir_local;
  
  clp._0_4_ = dir;
  if (macrodef != 0) {
    dobeep();
    ewprintf("Can\'t isearch in macro");
    return 0;
  }
  for (cip = 0; cip < 0x80; cip = cip + 1) {
    cmds[cip].s_code = -3;
  }
  strlcpy(local_88,pat,0x50);
  cip = 0;
  xcase = -1;
  _cbo = curwp->w_dotp;
  pptr = curwp->w_doto;
  iVar1 = curwp->w_dotline;
  is_lpush();
  is_cpush(0);
  firstc = 1;
  is_prompt((int)clp,1,1);
LAB_0011e779:
  do {
    while( true ) {
      while( true ) {
        update(2);
        success = getkey(0);
        if (success != 7) break;
        if (firstc == 1) {
          curwp->w_dotp = _cbo;
          curwp->w_doto = pptr;
          curwp->w_dotline = iVar1;
          curwp->w_rflag = curwp->w_rflag | 2;
          srch_lastdir = (int)clp;
          ctrlg(8,0);
          strlcpy(pat,local_88,0x50);
          return 2;
        }
        while (iVar4 = is_peek(), iVar4 == -4) {
          is_undo(&xcase,(int *)&clp);
        }
        firstc = 1;
        is_prompt((int)clp,(uint)(xcase < 0),1);
      }
      if (success != 8) break;
LAB_0011ede4:
      is_undo(&xcase,(int *)&clp);
      iVar4 = is_peek();
      if (iVar4 != -4) {
        firstc = 1;
      }
      is_prompt((int)clp,(uint)(xcase < 0),firstc);
    }
    if (success - 9U < 2) {
LAB_0011eeba:
      if (xcase == -1) {
        xcase = 0;
      }
      if (xcase == 0) {
        firstc = 1;
      }
      if (xcase == 0x4f) {
        dobeep();
      }
      else {
        pat[xcase] = (char)success;
        pat[xcase + 1] = '\0';
        xcase = xcase + 1;
      }
      is_lpush();
      if (firstc == 0) {
        is_cpush(-4);
      }
      else {
        iVar4 = is_find((int)clp);
        if (iVar4 == 0) {
          firstc = 0;
          dobeep();
          is_cpush(-4);
        }
        else {
          is_cpush(success);
        }
      }
      is_prompt((int)clp,0,firstc);
      goto LAB_0011e779;
    }
    if (success == 0xd) {
LAB_0011e865:
      srch_lastdir = (int)clp;
      curwp->w_markp = _cbo;
      curwp->w_marko = pptr;
      curwp->w_markline = iVar1;
      ewprintf("Mark set");
      return 1;
    }
    if (success == 0x11) {
LAB_0011ee1e:
      iVar4 = getkey(0);
      success = (int)(char)iVar4;
      goto LAB_0011eeba;
    }
    if (success == 0x12) {
      if ((int)clp == -1) {
        clp._0_4_ = -2;
        is_lpush();
        is_cpush(-2);
        firstc = 1;
      }
      if ((firstc == 0) && ((int)clp == -2)) {
        curwp->w_dotp = curbp->b_headp->l_bp;
        curwp->w_doto = curwp->w_dotp->l_used;
        curwp->w_dotline = curwp->w_bufp->b_lines;
        iVar4 = is_find(-2);
        if (iVar4 != 0) {
          is_cpush(-5);
          firstc = 1;
        }
        ewprintf("Overwrapped I-search: %s");
      }
      else {
        is_lpush();
        sVar5 = strlen(pat);
        xcase = (int)sVar5;
        iVar4 = backchar(8,1);
        if (iVar4 == 0) {
          dobeep();
          firstc = 0;
        }
        else {
          iVar4 = is_find(-2);
          if (iVar4 == 0) {
            forwchar(8,1);
            dobeep();
            firstc = 0;
          }
          else {
            is_cpush(-5);
          }
        }
        is_prompt((int)clp,(uint)(xcase < 0),firstc);
      }
    }
    else if (success == 0x13) {
      if ((int)clp == -2) {
        clp._0_4_ = -1;
        is_lpush();
        is_cpush(-1);
        firstc = 1;
      }
      if ((firstc == 0) && ((int)clp == -1)) {
        curwp->w_dotp = curbp->b_headp->l_fp;
        curwp->w_doto = 0;
        curwp->w_dotline = 1;
        iVar4 = is_find(-1);
        if (iVar4 != 0) {
          is_cpush(-5);
          firstc = 1;
        }
        ewprintf("Overwrapped I-search: %s");
      }
      else {
        is_lpush();
        sVar5 = strlen(pat);
        xcase = (int)sVar5;
        iVar4 = forwchar(8,1);
        if (iVar4 == 0) {
          dobeep();
          firstc = 0;
          ewprintf("Failed I-search: %s",pat);
        }
        else {
          iVar4 = is_find(-1);
          if (iVar4 == 0) {
            backchar(8,1);
            dobeep();
            firstc = 0;
            ewprintf("Failed I-search: %s",pat);
          }
          else {
            is_cpush(-5);
          }
        }
        is_prompt((int)clp,(uint)(xcase < 0),firstc);
      }
    }
    else {
      if (success != 0x17) {
        if (success == 0x1b) {
          iVar4 = ttwait(300);
          if (iVar4 == 0) {
            ungetkey(success);
          }
          goto LAB_0011e865;
        }
        if (success != 0x1c) {
          if (success == 0x7f) goto LAB_0011ede4;
          if ((cinfo[success & 0xff] & 8U) != 0) {
            ungetkey(success);
            curwp->w_markp = _cbo;
            curwp->w_marko = pptr;
            curwp->w_markline = iVar1;
            ewprintf("Mark set");
            curwp->w_rflag = curwp->w_rflag | 2;
            return 1;
          }
          goto LAB_0011eeba;
        }
        goto LAB_0011ee1e;
      }
      _cbo = curwp->w_dotp;
      pptr = curwp->w_doto;
      bVar2 = true;
      if (xcase == -1) {
        xcase = 0;
      }
      if ((int)clp == -2) {
        pptr = xcase + pptr;
      }
      bVar3 = false;
      opat[0x4c] = '\0';
      opat[0x4d] = '\0';
      opat[0x4e] = '\0';
      opat[0x4f] = '\0';
      for (; pat[(int)opat._76_4_] != '\0'; opat._76_4_ = opat._76_4_ + 1) {
        if ((cinfo[(byte)pat[(int)opat._76_4_]] & 2U) != 0) {
          bVar3 = true;
        }
      }
      while (pptr < _cbo->l_used) {
        iVar4 = pptr + 1;
        success = (int)(byte)_cbo->l_text[pptr];
        pptr = iVar4;
        if ((!bVar2) && (ppuVar6 = __ctype_b_loc(), ((*ppuVar6)[success] & 8) == 0)) break;
        if (xcase == 0x4f) {
          dobeep();
          break;
        }
        bVar2 = false;
        if ((!bVar3) && ((cinfo[success & 0xff] & 2U) != 0)) {
          success = success + 0x20;
        }
        iVar4 = xcase + 1;
        pat[xcase] = (char)success;
        pat[iVar4] = '\0';
        xcase = iVar4;
        if ((int)clp == -1) {
          curwp->w_doto = pptr;
          curwp->w_rflag = curwp->w_rflag | 2;
          update(2);
        }
      }
      is_prompt((int)clp,(uint)(xcase < 0),firstc);
    }
  } while( true );
}

Assistant:

static int
isearch(int dir)
{
	struct line	*clp;		/* Saved line pointer */
	int		 c;
	int		 cbo;		/* Saved offset */
	int		 success;
	int		 pptr;
	int		 firstc;
	int		 xcase;
	int		 i;
	char		 opat[NPAT];
	int		 cdotline;	/* Saved line number */

	if (macrodef) {
		dobeep();
		ewprintf("Can't isearch in macro");
		return (FALSE);
	}
	for (cip = 0; cip < NSRCH; cip++)
		cmds[cip].s_code = SRCH_NOPR;

	(void)strlcpy(opat, pat, sizeof(opat));
	cip = 0;
	pptr = -1;
	clp = curwp->w_dotp;
	cbo = curwp->w_doto;
	cdotline = curwp->w_dotline;
	is_lpush();
	is_cpush(SRCH_BEGIN);
	success = TRUE;
	is_prompt(dir, TRUE, success);

	for (;;) {
		update(CMODE);

		switch (c = getkey(FALSE)) {
		case CCHR('['):
			/*
			 * If new characters come in the next 300 msec,
			 * we can assume that they belong to a longer
			 * escaped sequence so we should ungetkey the
			 * ESC to avoid writing out garbage.
			 */
			if (ttwait(300) == FALSE)
				ungetkey(c);
			/* FALLTHRU */
		case CCHR('M'):
			srch_lastdir = dir;
			curwp->w_markp = clp;
			curwp->w_marko = cbo;
			curwp->w_markline = cdotline;
			ewprintf("Mark set");
			return (TRUE);
		case CCHR('G'):
			if (success != TRUE) {
				while (is_peek() == SRCH_ACCM)
					is_undo(&pptr, &dir);
				success = TRUE;
				is_prompt(dir, pptr < 0, success);
				break;
			}
			curwp->w_dotp = clp;
			curwp->w_doto = cbo;
			curwp->w_dotline = cdotline;
			curwp->w_rflag |= WFMOVE;
			srch_lastdir = dir;
			(void)ctrlg(FFRAND, 0);
			(void)strlcpy(pat, opat, sizeof(pat));
			return (ABORT);
		case CCHR('S'):
			if (dir == SRCH_BACK) {
				dir = SRCH_FORW;
				is_lpush();
				is_cpush(SRCH_FORW);
				success = TRUE;
			}
			if (success == FALSE && dir == SRCH_FORW) {
				/* wrap the search to beginning */
				curwp->w_dotp = bfirstlp(curbp);
				curwp->w_doto = 0;
				curwp->w_dotline = 1;
				if (is_find(dir) != FALSE) {
					is_cpush(SRCH_MARK);
					success = TRUE;
				}
				ewprintf("Overwrapped I-search: %s", pat);
				break;
			}
			is_lpush();
			pptr = strlen(pat);
			if (forwchar(FFRAND, 1) == FALSE) {
                                dobeep();
                                success = FALSE;
                                ewprintf("Failed I-search: %s", pat);
			} else {
				if (is_find(SRCH_FORW) != FALSE)
					is_cpush(SRCH_MARK);
				else {
					(void)backchar(FFRAND, 1);
					dobeep();
					success = FALSE;
					ewprintf("Failed I-search: %s", pat);
				}
			}
			is_prompt(dir, pptr < 0, success);
			break;
		case CCHR('R'):
			if (dir == SRCH_FORW) {
				dir = SRCH_BACK;
				is_lpush();
				is_cpush(SRCH_BACK);
				success = TRUE;
			}
			if (success == FALSE && dir == SRCH_BACK) {
				/* wrap the search to end */
				curwp->w_dotp = blastlp(curbp);
				curwp->w_doto = llength(curwp->w_dotp);
				curwp->w_dotline = curwp->w_bufp->b_lines;
				if (is_find(dir) != FALSE) {
					is_cpush(SRCH_MARK);
					success = TRUE;
				}
				ewprintf("Overwrapped I-search: %s", pat);
				break;
			}
			is_lpush();
			pptr = strlen(pat);
                        if (backchar(FFRAND, 1) == FALSE) {
                                dobeep();
                                success = FALSE;
                        } else {
				if (is_find(SRCH_BACK) != FALSE)
					is_cpush(SRCH_MARK);
				else {
					(void)forwchar(FFRAND, 1);
					dobeep();
					success = FALSE;
				}
			}
			is_prompt(dir, pptr < 0, success);
			break;
		case CCHR('W'):
			/* add the rest of the current word to the pattern */
			clp = curwp->w_dotp;
			cbo = curwp->w_doto;
			firstc = 1;
			if (pptr == -1)
				pptr = 0;
			if (dir == SRCH_BACK) {
				/* when isearching backwards, cbo is the start of the pattern */
				cbo += pptr;
			}

			/* if the search is case insensitive, add to pattern using lowercase */
			xcase = 0;
			for (i = 0; pat[i]; i++)
				if (ISUPPER(CHARMASK(pat[i])))
					xcase = 1;

			while (cbo < llength(clp)) {
				c = lgetc(clp, cbo++);
				if ((!firstc && !isalnum(c)))
					break;

				if (pptr == NPAT - 1) {
					dobeep();
					break;
				}
				firstc = 0;
				if (!xcase && ISUPPER(c))
					c = TOLOWER(c);

				pat[pptr++] = c;
				pat[pptr] = '\0';
				/* cursor only moves when isearching forwards */
				if (dir == SRCH_FORW) {
					curwp->w_doto = cbo;
					curwp->w_rflag |= WFMOVE;
					update(CMODE);
				}
			}
			is_prompt(dir, pptr < 0, success);
			break;
		case CCHR('H'):
		case CCHR('?'):
			is_undo(&pptr, &dir);
			if (is_peek() != SRCH_ACCM)
				success = TRUE;
			is_prompt(dir, pptr < 0, success);
			break;
		case CCHR('\\'):
		case CCHR('Q'):
			c = (char)getkey(FALSE);
			goto addchar;
		default:
			if (ISCTRL(c)) {
				ungetkey(c);
				curwp->w_markp = clp;
				curwp->w_marko = cbo;
				curwp->w_markline = cdotline;
				ewprintf("Mark set");
				curwp->w_rflag |= WFMOVE;
				return (TRUE);
			}
			/* FALLTHRU */
		case CCHR('I'):
		case CCHR('J'):
	addchar:
			if (pptr == -1)
				pptr = 0;
			if (pptr == 0)
				success = TRUE;
			if (pptr == NPAT - 1)
				dobeep();
			else {
				pat[pptr++] = c;
				pat[pptr] = '\0';
			}
			is_lpush();
			if (success != FALSE) {
				if (is_find(dir) != FALSE)
					is_cpush(c);
				else {
					success = FALSE;
					dobeep();
					is_cpush(SRCH_ACCM);
				}
			} else
				is_cpush(SRCH_ACCM);
			is_prompt(dir, FALSE, success);
		}
	}
	/* NOTREACHED */
}